

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

VariableID __thiscall spirv_cross::CompilerHLSL::remap_num_workgroups_builtin(CompilerHLSL *this)

{
  bool bVar1;
  mapped_type *this_00;
  SPIREntryPoint *pSVar2;
  TypedID<(spirv_cross::Types)2> local_488;
  TypedID<(spirv_cross::Types)0> local_484;
  StorageClass local_480;
  TypedID<(spirv_cross::Types)0> local_47c;
  SPIRType *local_478;
  SPIRType *ptr_type;
  undefined1 local_468 [8];
  SPIRType block_pointer_type;
  string local_310;
  TypeID local_2ec;
  ID local_2e8;
  TypedID<(spirv_cross::Types)1> local_2e4;
  undefined1 local_2e0 [8];
  SPIRType block_type;
  undefined1 local_180 [8];
  SPIRType uint_type;
  uint32_t local_28;
  uint32_t variable_id;
  uint32_t block_pointer_type_id;
  uint32_t block_type_id;
  uint32_t uint_type_id;
  uint32_t offset;
  CompilerHLSL *this_local;
  
  _uint_type_id = this;
  Compiler::update_active_builtins((Compiler *)this);
  bVar1 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x18);
  if (bVar1) {
    block_pointer_type_id =
         ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,4);
    variable_id = block_pointer_type_id + 1;
    local_28 = block_pointer_type_id + 2;
    uint_type.member_name_cache._M_h._M_single_bucket._4_4_ = block_pointer_type_id + 3;
    block_type_id = block_pointer_type_id;
    SPIRType::SPIRType((SPIRType *)local_180,OpTypeVector);
    uint_type.super_IVariant.self.id = 8;
    uint_type.super_IVariant._12_4_ = 0x20;
    uint_type.basetype = SByte;
    uint_type.width = 1;
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,block_pointer_type_id,(SPIRType *)local_180);
    SPIRType::SPIRType((SPIRType *)local_2e0,OpTypeStruct);
    block_type.super_IVariant.self.id = 0xf;
    TypedID<(spirv_cross::Types)1>::TypedID(&local_2e4,block_pointer_type_id);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)&block_type.storage,
               &local_2e4);
    Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
              ((Compiler *)this,variable_id,(SPIRType *)local_2e0);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_2e8,variable_id);
    Compiler::set_decoration((Compiler *)this,local_2e8,DecorationBlock,0);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_2ec,variable_id);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_310,"count",
               (allocator *)((long)&block_pointer_type.member_name_cache._M_h._M_single_bucket + 7))
    ;
    Compiler::set_member_name((Compiler *)this,local_2ec,0,&local_310);
    ::std::__cxx11::string::~string((string *)&local_310);
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&block_pointer_type.member_name_cache._M_h._M_single_bucket + 7));
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)
               &block_pointer_type.member_name_cache._M_h._M_single_bucket,variable_id);
    Compiler::set_member_decoration
              ((Compiler *)this,block_pointer_type.member_name_cache._M_h._M_single_bucket._0_4_,0,
               DecorationOffset,0);
    SPIRType::SPIRType((SPIRType *)local_468,(SPIRType *)local_2e0);
    block_pointer_type.array_size_literal.stack_storage.aligned_char[4] = '\x01';
    block_pointer_type.pointer_depth = 2;
    TypedID<(spirv_cross::Types)1>::TypedID
              ((TypedID<(spirv_cross::Types)1> *)((long)&ptr_type + 4),variable_id);
    block_pointer_type.image.access = ptr_type._4_4_;
    local_478 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                          ((Compiler *)this,local_28,(SPIRType *)local_468);
    TypedID<(spirv_cross::Types)0>::TypedID(&local_47c,variable_id);
    (local_478->super_IVariant).self.id = local_47c.id;
    local_480 = StorageClassUniform;
    Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
              ((Compiler *)this,uint_type.member_name_cache._M_h._M_single_bucket._4_4_,&local_28,
               &local_480);
    TypedID<(spirv_cross::Types)0>::TypedID
              (&local_484,uint_type.member_name_cache._M_h._M_single_bucket._4_4_);
    this_00 = ::std::
              unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
              ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_484);
    ::std::__cxx11::string::operator=((string *)this_00,"SPIRV_Cross_NumWorkgroups");
    this->num_workgroups_builtin = uint_type.member_name_cache._M_h._M_single_bucket._4_4_;
    pSVar2 = Compiler::get_entry_point((Compiler *)this);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_488,this->num_workgroups_builtin);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
              (&pSVar2->interface_variables,&local_488);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4),
               uint_type.member_name_cache._M_h._M_single_bucket._4_4_);
    SPIRType::~SPIRType((SPIRType *)local_468);
    SPIRType::~SPIRType((SPIRType *)local_2e0);
    SPIRType::~SPIRType((SPIRType *)local_180);
  }
  else {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&this_local + 4),0);
  }
  return (VariableID)this_local._4_4_;
}

Assistant:

VariableID CompilerHLSL::remap_num_workgroups_builtin()
{
	update_active_builtins();

	if (!active_input_builtins.get(BuiltInNumWorkgroups))
		return 0;

	// Create a new, fake UBO.
	uint32_t offset = ir.increase_bound_by(4);

	uint32_t uint_type_id = offset;
	uint32_t block_type_id = offset + 1;
	uint32_t block_pointer_type_id = offset + 2;
	uint32_t variable_id = offset + 3;

	SPIRType uint_type { OpTypeVector };
	uint_type.basetype = SPIRType::UInt;
	uint_type.width = 32;
	uint_type.vecsize = 3;
	uint_type.columns = 1;
	set<SPIRType>(uint_type_id, uint_type);

	SPIRType block_type { OpTypeStruct };
	block_type.basetype = SPIRType::Struct;
	block_type.member_types.push_back(uint_type_id);
	set<SPIRType>(block_type_id, block_type);
	set_decoration(block_type_id, DecorationBlock);
	set_member_name(block_type_id, 0, "count");
	set_member_decoration(block_type_id, 0, DecorationOffset, 0);

	SPIRType block_pointer_type = block_type;
	block_pointer_type.pointer = true;
	block_pointer_type.storage = StorageClassUniform;
	block_pointer_type.parent_type = block_type_id;
	auto &ptr_type = set<SPIRType>(block_pointer_type_id, block_pointer_type);

	// Preserve self.
	ptr_type.self = block_type_id;

	set<SPIRVariable>(variable_id, block_pointer_type_id, StorageClassUniform);
	ir.meta[variable_id].decoration.alias = "SPIRV_Cross_NumWorkgroups";

	num_workgroups_builtin = variable_id;
	get_entry_point().interface_variables.push_back(num_workgroups_builtin);
	return variable_id;
}